

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O1

bool __thiscall
IRT::JumpPattern::TryToGenerateCode
          (JumpPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CJumpStatement *this_00;
  CLabelStatement *this_01;
  undefined1 local_69;
  shared_ptr<AssemblyCode::JumpCommand> local_68;
  string local_58;
  CLabel local_38;
  
  if (tree == (INode *)0x0) {
    this_00 = (CJumpStatement *)0x0;
  }
  else {
    this_00 = (CJumpStatement *)__dynamic_cast(tree,&INode::typeinfo,&CJumpStatement::typeinfo,0);
  }
  if (this_00 != (CJumpStatement *)0x0) {
    this_01 = CJumpStatement::getLabel(this_00);
    CLabelStatement::Label(&local_38,this_01);
    CLabel::ToString_abi_cxx11_(&local_58,&local_38);
    local_68.super___shared_ptr<AssemblyCode::JumpCommand,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<AssemblyCode::JumpCommand,std::allocator<AssemblyCode::JumpCommand>,std::__cxx11::string>
              (&local_68.super___shared_ptr<AssemblyCode::JumpCommand,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(JumpCommand **)&local_68,
               (allocator<AssemblyCode::JumpCommand> *)&local_69,&local_58);
    std::
    vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
    ::emplace_back<std::shared_ptr<AssemblyCode::JumpCommand>>
              ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                *)commands,&local_68);
    if (local_68.super___shared_ptr<AssemblyCode::JumpCommand,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.super___shared_ptr<AssemblyCode::JumpCommand,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38.label._M_dataplus._M_p != &local_38.label.field_2) {
      operator_delete(local_38.label._M_dataplus._M_p);
    }
  }
  return this_00 != (CJumpStatement *)0x0;
}

Assistant:

bool IRT::JumpPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                          AssemblyCommands &commands ) {
    ConstJumpPtr jumpPtr = dynamic_cast<ConstJumpPtr>(tree);
    if ( jumpPtr ) {
        commands.emplace_back(
                std::make_shared<AssemblyCode::JumpCommand>( jumpPtr->getLabel( )->Label( ).ToString( )));
        return true;
    }
    return false;
}